

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

float __thiscall cnn::Model::gradient_l2_norm(Model *this)

{
  bool bVar1;
  void *pvVar2;
  reference ppPVar3;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *in_RDI;
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  size_t in_stack_00000008;
  int i;
  double gg;
  ParametersBase *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *__range1;
  int pi;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar6;
  double local_38;
  __normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
  local_20 [2];
  int local_c;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::size(in_RDI);
    pvVar2 = cnn_mm_malloc((size_t)gg,in_stack_00000008);
    *(void **)(in_RDI + 0x48) = pvVar2;
  }
  local_c = 0;
  local_20[0]._M_current =
       (ParametersBase **)
       std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::begin(in_RDI);
  std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (__normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
              ::operator*(local_20);
    (*(*ppPVar3)->_vptr_ParametersBase[2])(*ppPVar3,*(long *)(in_RDI + 0x48) + (long)local_c * 4);
    local_c = local_c + 1;
    __gnu_cxx::
    __normal_iterator<cnn::ParametersBase_*const_*,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
    ::operator++(local_20);
  }
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  local_38 = 0.0;
  for (iVar6 = 0; iVar6 < local_c; iVar6 = iVar6 + 1) {
    local_38 = (double)*(float *)(*(long *)(in_RDI + 0x48) + (long)iVar6 * 4) + local_38;
    auVar4 = ZEXT864((ulong)local_38);
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_38;
  auVar5 = vsqrtsd_avx(auVar4._0_16_,auVar5);
  return (float)auVar5._0_8_;
}

Assistant:

float Model::gradient_l2_norm() const {
  if (!gradient_norm_scratch)
    gradient_norm_scratch = (float*)cnn_mm_malloc(all_params.size() * sizeof(float), 256);
  int pi = 0;
  for (auto p : all_params) {
    p->g_squared_l2norm(&gradient_norm_scratch[pi]);
    ++pi;
  }
#if HAVE_CUDA
  float res = 0;
  gpu::l2_norm_reducer(all_params.size(), gradient_norm_scratch, gradient_norm_scratch, false, false);
  cudaMemcpy(&res, gradient_norm_scratch, sizeof(float),  cudaMemcpyDeviceToHost);
  return sqrt(res);
#else
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += gradient_norm_scratch[i];
  return sqrt(gg);
#endif
}